

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O2

vm_obj_id_t __thiscall
CVmTimeZone::get_history_item(CVmTimeZone *this,int32_t dayno,int32_t daytime)

{
  vm_obj_id_t vVar1;
  vmtzquery result;
  undefined1 local_40 [16];
  vmtz_ttype local_30;
  undefined1 local_20 [16];
  char *pcStack_10;
  
  query(this,(vmtzquery *)local_20,dayno,daytime,0);
  local_40._8_8_ = &local_30;
  local_30.gmtofs = local_20._8_4_;
  local_30.save = local_20._12_4_;
  local_30.fmt = pcStack_10;
  local_40._0_8_ = local_20._0_8_;
  vVar1 = vmtz_trans::get_as_list((vmtz_trans *)local_40);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmTimeZone::get_history_item(
    VMG_ int32_t dayno, int32_t daytime) const
{
    /* query the transition for the given date/time */
    vmtzquery result;
    query(&result, dayno, daytime, FALSE);

    /* synthesize a transition description */
    vmtz_ttype tty(&result);
    vmtz_trans t(result.start_dayno, result.start_daytime, &tty);

    /* build and return the List representation */
    return t.get_as_list(vmg0_);
}